

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O3

double __thiscall
duckdb::FinalizeEntropy<duckdb::ModeState<duckdb::string_t,duckdb::ModeString>>
          (duckdb *this,ModeState<duckdb::string_t,_duckdb::ModeString> *state)

{
  long *plVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double dVar5;
  double dVar6;
  double dVar7;
  
  dVar6 = 0.0;
  if ((this != (duckdb *)0x0) && (plVar1 = *(long **)(this + 0x18), plVar1 != (long *)0x0)) {
    auVar3._8_4_ = (int)((ulong)state >> 0x20);
    auVar3._0_8_ = state;
    auVar3._12_4_ = 0x45300000;
    dVar5 = (auVar3._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)state) - 4503599627370496.0);
    dVar6 = 0.0;
    do {
      auVar4._0_8_ = (double)CONCAT44(0x43300000,(int)plVar1[3]);
      auVar4._8_4_ = (int)((ulong)plVar1[3] >> 0x20);
      auVar4._12_4_ = 0x45300000;
      dVar7 = (auVar4._8_8_ - 1.9342813113834067e+25) + (auVar4._0_8_ - 4503599627370496.0);
      dVar2 = log2(dVar5 / dVar7);
      dVar6 = dVar6 + dVar2 * (dVar7 / dVar5);
      plVar1 = (long *)*plVar1;
    } while (plVar1 != (long *)0x0);
  }
  return dVar6;
}

Assistant:

static double FinalizeEntropy(STATE &state) {
	if (!state.frequency_map) {
		return 0;
	}
	double count = static_cast<double>(state.count);
	double entropy = 0;
	for (auto &val : *state.frequency_map) {
		double val_sec = static_cast<double>(val.second.count);
		entropy += (val_sec / count) * log2(count / val_sec);
	}
	return entropy;
}